

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCArray NULLCTypeInfo::MemberName(int member,int *type)

{
  NULLCArray NVar1;
  ExternTypeInfo *pEVar2;
  char *pcVar3;
  size_t sVar4;
  int local_54;
  char *pcStack_50;
  int n;
  char *memberName;
  uint strLength;
  char *symbols;
  ExternTypeInfo *exType;
  NULLCArray ret;
  int *type_local;
  int member_local;
  uint local_c;
  
  type_local._0_4_ = member;
  if (linker != 0) {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*type);
    if (pEVar2->subCat == CAT_CLASS) {
      if ((uint)type_local < (pEVar2->field_8).arrSize) {
        pcStack_50 = FastVector<char,_false,_false>::operator[]
                               ((FastVector<char,_false,_false> *)(linker + 0x290),0);
        sVar4 = strlen(pcStack_50 + pEVar2->offsetToName);
        pcStack_50 = pcStack_50 + (ulong)((int)sVar4 + 1) + (ulong)pEVar2->offsetToName;
        for (local_54 = 0; local_54 < (int)(uint)type_local; local_54 = local_54 + 1) {
          sVar4 = strlen(pcStack_50);
          pcStack_50 = pcStack_50 + ((int)sVar4 + 1);
        }
        sVar4 = strlen(pcStack_50);
        local_c = (int)sVar4 + 1;
        stack0xffffffffffffffec = pcStack_50;
      }
      else {
        pcVar3 = FastVector<char,_false,_false>::operator[]
                           ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar2->offsetToName)
        ;
        nullcThrowError("typeid::memberName: member number illegal, type (%s) has only %d members",
                        pcVar3,(ulong)(pEVar2->field_8).arrSize);
        memset((void *)((long)&type_local + 4),0,0xc);
      }
    }
    else {
      FastVector<char,_false,_false>::operator[]
                ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar2->offsetToName);
      nullcThrowError("typeid::memberName: type (%s) is not a class");
      memset((void *)((long)&type_local + 4),0,0xc);
    }
    NVar1.len = local_c;
    NVar1.ptr = stack0xffffffffffffffec;
    return NVar1;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x2d,"NULLCArray NULLCTypeInfo::MemberName(int, int *)");
}

Assistant:

NULLCArray MemberName(int member, int* type)
	{
		assert(linker);
		NULLCArray ret;

		ExternTypeInfo &exType = linker->exTypes[*type];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
		{
			nullcThrowError("typeid::memberName: type (%s) is not a class", &linker->exSymbols[exType.offsetToName]);
			return NULLCArray();
		}
		if((unsigned int)member >= exType.memberCount)
		{
			nullcThrowError("typeid::memberName: member number illegal, type (%s) has only %d members", &linker->exSymbols[exType.offsetToName], exType.memberCount);
			return NULLCArray();
		}
		char *symbols = &linker->exSymbols[0];
		unsigned int strLength = (unsigned int)strlen(symbols + exType.offsetToName) + 1;
		const char *memberName = symbols + exType.offsetToName + strLength;
		for(int n = 0; n < member; n++)
		{
			strLength = (unsigned int)strlen(memberName) + 1;
			memberName += strLength;
		}

		ret.ptr = (char*)memberName;
		ret.len = (unsigned int)strlen(memberName) + 1;
		return ret;
	}